

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type sVar1;
  ulong uVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  path *ppVar6;
  long lVar7;
  path *__p;
  undefined1 auVar8 [16];
  directory_iterator __begin1;
  string platp;
  path ext;
  string output_path;
  string backgr_path;
  string plates_path;
  directory_iterator local_1b8;
  int local_1a4;
  directory_iterator local_1a0;
  string local_190;
  string local_170;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  string local_130;
  double local_110;
  path local_108;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  path local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  path local_58;
  
  if (argc < 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Usage: datset /path/to/plates/ /path/to/background/ ./output_path output_image_size scale_factor number_of_warps\n"
               ,0x71);
    return -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,argv[1],(allocator<char> *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,argv[2],(allocator<char> *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,argv[3],(allocator<char> *)&local_108);
  local_1a4 = atoi(argv[4]);
  local_110 = atof(argv[5]);
  local_150 = &local_140;
  local_148 = 0;
  local_140 = 0;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_108,&local_78,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_1a0,&local_108,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_108);
  if (local_1a0._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_1b8._M_dir._M_ptr = local_1a0._M_dir._M_ptr;
    local_1b8._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_1a0._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_1a0._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
      local_1b8._M_dir._M_ptr = local_1a0._M_dir._M_ptr;
      local_1b8._M_dir._M_refcount._M_pi = local_1a0._M_dir._M_refcount._M_pi;
      if (local_1a0._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_001088ff;
    }
    else {
      *(int *)(local_1a0._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_1a0._M_dir._M_refcount._M_pi + 8) + 1;
    }
    local_1b8._M_dir._M_ptr = local_1a0._M_dir._M_ptr;
    local_1b8._M_dir._M_refcount._M_pi = local_1a0._M_dir._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_1a0._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_1a0._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_1a0._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_1a0._M_dir._M_refcount._M_pi + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0._M_dir._M_refcount._M_pi);
  }
LAB_001088ff:
  do {
    if (local_1b8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (local_1a0._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a0._M_dir._M_refcount._M_pi);
      }
      if (local_150 != &local_140) {
        operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      if (local_c0 != local_b0) {
        operator_delete(local_c0,local_b0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      return 0;
    }
    ppVar6 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_1b8);
    sVar1 = (ppVar6->_M_pathname)._M_string_length;
    if (sVar1 == 0) {
LAB_00108990:
      std::filesystem::__cxx11::path::path(&local_a0);
    }
    else {
      uVar2 = *(ulong *)&ppVar6->_M_cmpts;
      uVar4 = (uint)uVar2;
      __p = ppVar6;
      if ((~(byte)uVar2 & 3) != 0) {
        if (((uVar2 & 3) == 0) && ((ppVar6->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
          if ((uVar2 & 3) == 0) {
            lVar7 = std::filesystem::__cxx11::path::_List::end();
            __p = (path *)(lVar7 + -0x30);
            if ((*(ulong *)&ppVar6->_M_cmpts & 3) != 0) {
              __p = ppVar6;
            }
            uVar4 = (uint)*(undefined8 *)&__p->_M_cmpts;
          }
          if ((~uVar4 & 3) == 0) goto LAB_00108986;
        }
        goto LAB_00108990;
      }
LAB_00108986:
      std::filesystem::__cxx11::path::path(&local_a0,__p);
    }
    auVar8 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar8._8_8_ == -1 || auVar8._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(&local_108);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_58,auVar8._0_8_);
      std::filesystem::__cxx11::path::path(&local_108,&local_58._M_pathname,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_pathname._M_dataplus._M_p != &local_58._M_pathname.field_2) {
        operator_delete(local_58._M_pathname._M_dataplus._M_p,
                        local_58._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::path::~path(&local_a0);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_a0,(char (*) [5])".jpg",auto_format);
    iVar5 = std::filesystem::__cxx11::path::compare(&local_108);
    if (iVar5 == 0) {
      std::filesystem::__cxx11::path::~path(&local_a0);
LAB_00108a7e:
      local_a0._M_pathname._M_dataplus._M_p = (pointer)&local_a0._M_pathname.field_2;
      pcVar3 = (ppVar6->_M_pathname)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar3,pcVar3 + (ppVar6->_M_pathname)._M_string_length);
      std::__cxx11::string::operator=((string *)&local_150,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_pathname._M_dataplus._M_p != &local_a0._M_pathname.field_2) {
        operator_delete(local_a0._M_pathname._M_dataplus._M_p,
                        local_a0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_150,local_150 + local_148);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_c0,local_b8 + (long)local_c0);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_e0,local_d8 + (long)local_e0);
      generateDatasetImages(&local_170,&local_190,&local_130,local_1a4,local_110,5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                (&local_58,(char (*) [5])".png",auto_format);
      iVar5 = std::filesystem::__cxx11::path::compare(&local_108);
      std::filesystem::__cxx11::path::~path(&local_58);
      std::filesystem::__cxx11::path::~path(&local_a0);
      if (iVar5 == 0) goto LAB_00108a7e;
    }
    std::filesystem::__cxx11::path::~path(&local_108);
    std::filesystem::__cxx11::directory_iterator::operator++(&local_1b8);
  } while( true );
}

Assistant:

int main(int argc, char const *argv[]) {
    if (argc<6) {
        cout<<"Usage: datset /path/to/plates/ /path/to/background/ ./output_path output_image_size scale_factor number_of_warps\n";
        return -1;
    }

    string plates_path = string(argv[1]);
    string backgr_path = string(argv[2]);
    string output_path = string(argv[3]);
    int image_size = atoi(argv[4]);
    double plate_scale = atof(argv[5]);

    string platp;
    for (const auto & entry : filesystem::directory_iterator(plates_path)) {
        auto ext = entry.path().filename().extension();
        if (ext == ".jpg" || ext ==".png") { 
            platp = entry.path();
            generateDatasetImages(platp, backgr_path, output_path,  image_size, plate_scale, 5);
        }
    } 
    return 0;
}